

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeLoop
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig)

{
  Loop *loop;
  
  loop = MixedArena::alloc<wasm::Loop>(&this->wasm->allocator);
  (loop->name).super_IString.str._M_len = label.super_IString.str._M_len;
  (loop->name).super_IString.str._M_str = label.super_IString.str._M_str;
  (loop->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id =
       sig.results.id.id;
  visitLoopStart(__return_storage_ptr__,this,loop,sig.params.id);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeLoop(Name label, Signature sig) {
  auto* loop = wasm.allocator.alloc<Loop>();
  loop->name = label;
  loop->type = sig.results;
  return visitLoopStart(loop, sig.params);
}